

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O3

FT_Bool tt_face_get_paint_layers
                  (TT_Face face,FT_LayerIterator *iterator,FT_OpaquePaint *opaque_paint)

{
  FT_UInt FVar1;
  uint uVar2;
  void *pvVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  FT_Byte *pFVar8;
  uint *puVar9;
  
  FVar1 = iterator->layer;
  if ((FVar1 != iterator->num_layers) && (pvVar3 = face->colr, pvVar3 != (void *)0x0)) {
    puVar4 = (uint *)iterator->p;
    puVar9 = (uint *)((long)puVar4 + (-4 - (ulong)(FVar1 * 4)));
    puVar5 = *(uint **)((long)pvVar3 + 0x30);
    if ((puVar5 <= puVar9) &&
       ((puVar5 <= puVar4 && (puVar9 < puVar5 + *(long *)((long)pvVar3 + 0x28) + 1)))) {
      lVar6 = *(long *)((long)pvVar3 + 0x80);
      lVar7 = *(long *)((long)pvVar3 + 0x88);
      if (puVar4 <= (uint *)(lVar6 + lVar7 + -4)) {
        uVar2 = *puVar4;
        opaque_paint->insert_root_transform = '\0';
        pFVar8 = (FT_Byte *)
                 ((long)puVar5 +
                 (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18));
        if (pFVar8 < (FT_Byte *)(lVar6 + lVar7) && *(FT_Byte **)((long)pvVar3 + 0x40) <= pFVar8) {
          opaque_paint->p = pFVar8;
          iterator->p = (FT_Byte *)(puVar4 + 1);
          iterator->layer = FVar1 + 1;
          return '\x01';
        }
      }
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_paint_layers( TT_Face            face,
                            FT_LayerIterator*  iterator,
                            FT_OpaquePaint*    opaque_paint )
  {
    FT_Byte*   p             = NULL;
    FT_Byte*   p_first_layer = NULL;
    FT_Byte*   p_paint       = NULL;
    FT_UInt32  paint_offset;

    Colr*  colr;


    if ( iterator->layer == iterator->num_layers )
      return 0;

    colr = (Colr*)face->colr;
    if ( !colr )
      return 0;

    /*
     * We have an iterator pointing at a paint offset as part of the
     * `paintOffset` array in `LayerV1List`.
     */
    p = iterator->p;

    /*
     * Do a cursor sanity check of the iterator.  Counting backwards from
     * where it stands, we need to end up at a position after the beginning
     * of the `LayerV1List` table and not after the end of the
     * `LayerV1List`.
     */
    p_first_layer = p -
                      iterator->layer * LAYER_V1_LIST_PAINT_OFFSET_SIZE -
                      LAYER_V1_LIST_NUM_LAYERS_SIZE;
    if ( p_first_layer < (FT_Byte*)colr->layers_v1 )
      return 0;
    if ( p_first_layer >= (FT_Byte*)(
           colr->layers_v1 + LAYER_V1_LIST_NUM_LAYERS_SIZE +
           colr->num_layers_v1 * LAYER_V1_LIST_PAINT_OFFSET_SIZE ) )
      return 0;

    /*
     * Before reading, ensure that `p` is within 'COLR' v1 and we can read a
     * 4-byte ULONG.
     */
    if ( p < colr->layers_v1                              ||
         p > (FT_Byte*)colr->table + colr->table_size - 4 )
      return 0;

    paint_offset =
      FT_NEXT_ULONG( p );
    opaque_paint->insert_root_transform =
      0;

    p_paint = (FT_Byte*)( colr->layers_v1 + paint_offset );

    if ( p_paint < colr->paints_start_v1                         ||
         p_paint >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    opaque_paint->p = p_paint;

    iterator->p = p;

    iterator->layer++;

    return 1;
  }